

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmSystemTools::ParseArguments_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmSystemTools *this,char *command)

{
  cmSystemTools cVar1;
  bool bVar2;
  cmSystemTools *pcVar3;
  string arg;
  value_type local_50;
  
  bVar2 = false;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  cVar1 = *this;
  if (cVar1 == (cmSystemTools)0x2f) goto LAB_00354972;
  if ((this[1] == (cmSystemTools)0x3a) && (this[2] == (cmSystemTools)0x5c)) {
LAB_0035496b:
    bVar2 = true;
  }
  else {
    if (cVar1 == (cmSystemTools)0x5c) {
      cVar1 = this[1];
joined_r0x0035495d:
      if (cVar1 == (cmSystemTools)0x5c) goto LAB_0035496b;
    }
    else if (cVar1 == (cmSystemTools)0x27) {
      if ((this[1] != (cmSystemTools)0x2f) && (this[2] == (cmSystemTools)0x3a)) {
        cVar1 = this[3];
        goto joined_r0x0035495d;
      }
    }
    else if (((cVar1 == (cmSystemTools)0x22) && (this[1] != (cmSystemTools)0x2f)) &&
            (this[2] == (cmSystemTools)0x3a)) {
      cVar1 = this[3];
      goto joined_r0x0035495d;
    }
    bVar2 = false;
  }
LAB_00354972:
  if (*this != (cmSystemTools)0x0) {
    do {
      for (; (*this == (cmSystemTools)0x20 || (*this == (cmSystemTools)0x9)); this = this + 1) {
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_50,0,(char *)local_50._M_string_length,0x5e5069);
      cVar1 = *this;
      if (cVar1 != (cmSystemTools)0x0) {
        if (cVar1 == (cmSystemTools)0x22) {
          while( true ) {
            pcVar3 = this + 1;
            cVar1 = *pcVar3;
            if ((cVar1 == (cmSystemTools)0x0) || (cVar1 == (cmSystemTools)0x22)) break;
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_50,local_50._M_string_length,0,'\x01');
            this = pcVar3;
          }
          this = this + 2;
          if (cVar1 == (cmSystemTools)0x0) {
            this = pcVar3;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_50);
        }
        else {
          pcVar3 = this;
          if (cVar1 == (cmSystemTools)0x27) {
            while( true ) {
              pcVar3 = this + 1;
              cVar1 = *pcVar3;
              if ((cVar1 == (cmSystemTools)0x0) || (cVar1 == (cmSystemTools)0x27)) break;
              std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_50,local_50._M_string_length,0,'\x01');
              this = pcVar3;
            }
            this = this + 2;
            if (cVar1 == (cmSystemTools)0x0) {
              this = pcVar3;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
          }
          else {
            while( true ) {
              while (this = pcVar3, cVar1 = *this, cVar1 == (cmSystemTools)0x5c) {
                if (bVar2) goto LAB_00354a29;
                pcVar3 = this + 1;
                if (this[1] != (cmSystemTools)0x0) {
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)&local_50,local_50._M_string_length,0,'\x01');
                  pcVar3 = this + 2;
                }
              }
              if (((byte)cVar1 < 0x21) && ((0x100000201U >> ((ulong)(byte)cVar1 & 0x3f) & 1) != 0))
              break;
LAB_00354a29:
              std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_50,local_50._M_string_length,0,'\x01');
              pcVar3 = this + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
          }
        }
      }
    } while (*this != (cmSystemTools)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const char* command)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  if ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
      (command[0] == '\"' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\'' && command[1] != '/' && command[2] == ':'
       && command[3] == '\\') ||
      (command[0] == '\\' && command[1] == '\\'))
    {
    win_path = true;
    }
  // Split the command into an argv array.
  for(const char* c = command; *c;)
    {
    // Skip over whitespace.
    while(*c == ' ' || *c == '\t')
      {
      ++c;
      }
    arg = "";
    if(*c == '"')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '"')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c == '\'')
      {
      // Parse a quoted argument.
      ++c;
      while(*c && *c != '\'')
        {
        arg.append(1, *c);
        ++c;
        }
      if(*c)
        {
        ++c;
        }
      args.push_back(arg);
      }
    else if(*c)
      {
      // Parse an unquoted argument.
      while(*c && *c != ' ' && *c != '\t')
        {
        if(*c == '\\' && !win_path)
          {
          ++c;
          if(*c)
            {
            arg.append(1, *c);
            ++c;
            }
          }
        else
          {
          arg.append(1, *c);
          ++c;
          }
        }
      args.push_back(arg);
      }
    }

  return args;
}